

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

ssize_t __thiscall chatter::Packet::write(Packet *this,int __fd,void *__buf,size_t __n)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  uint64_t uVar4;
  undefined4 in_register_00000034;
  uint64_t local_20;
  
  local_20 = CONCAT44(in_register_00000034,__fd);
  uVar4 = platform::HostToNet64(&local_20);
  puVar1 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_data,(size_type)(puVar1 + (8 - (long)puVar2)));
  puVar3 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(uint64_t *)(puVar1 + ((long)puVar3 - (long)puVar2)) = uVar4;
  return (ssize_t)puVar3;
}

Assistant:

void Packet::write(uint64_t data)
{
    uint64_t net = platform::HostToNet64(data);
    append_bytes(&net, sizeof(net));
}